

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O2

bool duckdb::AnyTies(bool *ties,idx_t *count)

{
  byte bVar1;
  byte bVar2;
  idx_t i;
  long lVar3;
  
  bVar2 = 0;
  for (lVar3 = 0; *count - 1 != lVar3; lVar3 = lVar3 + 1) {
    bVar1 = bVar2 & 1;
    bVar2 = 1;
    if (bVar1 == 0) {
      bVar2 = ties[lVar3];
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

static bool AnyTies(bool ties[], const idx_t &count) {
	D_ASSERT(!ties[count - 1]);
	bool any_ties = false;
	for (idx_t i = 0; i < count - 1; i++) {
		any_ties = any_ties || ties[i];
	}
	return any_ties;
}